

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

bool __thiscall FC_BPNN::Backward(FC_BPNN *this)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  size_type sVar5;
  reference this_00;
  reference ppVar6;
  reference pvVar7;
  reference pvVar8;
  long *local_68;
  int local_4c;
  int j;
  size_t finder1;
  size_t finder;
  pair<const_unsigned_long,_Preceptron_*> *element;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int i;
  FC_BPNN *this_local;
  
  sVar5 = std::
          vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
          ::size(&this->net);
  __range2._4_4_ = (int)sVar5;
  while (iVar3 = __range2._4_4_, __range2._4_4_ = iVar3 + -1, -1 < __range2._4_4_) {
    this_00 = std::
              vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
              ::operator[](&this->net,(long)__range2._4_4_);
    __end2 = std::
             map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
             ::begin(this_00);
    element = (pair<const_unsigned_long,_Preceptron_*> *)
              std::
              map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
              ::end(this_00);
    while (bVar4 = std::operator!=(&__end2,(_Self *)&element), bVar4) {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Preceptron_*>_>::operator*
                         (&__end2);
      uVar2 = ppVar6->first;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->layers_error,(long)iVar3);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,uVar2 & 0xffffffff);
      ppVar6->second->error = *pvVar8;
      if (ppVar6->second == (Preceptron *)0x0) {
        local_68 = (long *)0x0;
      }
      else {
        local_68 = (long *)__dynamic_cast(ppVar6->second,&Preceptron::typeinfo,
                                          &Preceptron_SIGMOID::typeinfo,0);
      }
      (**(code **)(*local_68 + 0x20))();
      for (local_4c = 0;
          sVar5 = std::vector<double,_std::allocator<double>_>::size(&ppVar6->second->delta_weight),
          (ulong)(long)local_4c < sVar5; local_4c = local_4c + 1) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&ppVar6->second->delta_weight,(long)local_4c);
        dVar1 = *pvVar8;
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->layers_error,(long)__range2._4_4_);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)local_4c);
        *pvVar8 = dVar1 + *pvVar8;
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Preceptron_*>_>::operator++(&__end2);
    }
  }
  return true;
}

Assistant:

bool FC_BPNN::Backward()
{
	for (int i = net.size() - 1; i >= 0; i--) {
		for (auto& element : net[i]) {
			size_t finder = element.first;
			size_t finder1 = finder & 0X00000000FFFFFFFF;
			element.second->error = layers_error[i + 1][finder1];
			dynamic_cast<Preceptron_SIGMOID*>(element.second)->Backward();
			for (int j = 0; j < element.second->delta_weight.size(); j++) {
				layers_error[i][j] += element.second->delta_weight[j];
			}
		}
	}
	return true;
}